

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::NodeTranslator::compileAnnotationApplications
          (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *__return_storage_ptr__,
          NodeTranslator *this,Reader annotations,StringPtr targetsFlagName)

{
  ErrorReporter *pEVar1;
  BrandedDecl *pBVar2;
  Resolver *pRVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Builder target;
  Reader source;
  Reader source_00;
  Reader type;
  Builder target_00;
  Reader type_00;
  ImplicitParams implicitMethodParams;
  undefined1 auVar11 [40];
  Builder target_01;
  Reader name_00;
  Reader name_01;
  Reader name_02;
  Reader name_03;
  StringPtr name_04;
  BrandScope **ppBVar12;
  RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *ppBVar13;
  BrandScope **ppBVar14;
  SegmentBuilder *pSVar15;
  undefined2 uVar16;
  BrandScope *pBVar17;
  ReaderFor<bool> RVar18;
  short sVar19;
  ListElementCount LVar20;
  WirePointer *pWVar21;
  undefined8 uVar22;
  SegmentBuilder *pSVar23;
  undefined8 uVar24;
  BrandScope *pBVar25;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  Fault FVar29;
  NodeTranslator *this_00;
  SegmentBuilder *in_R8;
  undefined8 uVar30;
  SegmentBuilder *pSVar31;
  undefined4 uVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  Builder scope;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *result;
  Vector<capnp::compiler::NodeTranslator::BrandScope_*> levels;
  Reader name;
  Builder scopes;
  Builder annotationBuilder;
  Builder bindings;
  Reader annotation;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> decl;
  BuilderFor<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> builder;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  StructDataBitCount SVar41;
  int iVar42;
  WirePointer *in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb58;
  undefined6 in_stack_fffffffffffffb60;
  short in_stack_fffffffffffffb66;
  undefined1 uStack_469;
  undefined4 uStack_464;
  short local_460;
  Vector<capnp::compiler::NodeTranslator::BrandScope_*> local_448;
  StructReader local_428;
  SegmentBuilder *local_3f8;
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_3f0;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 *local_388;
  BrandScope *pBStack_380;
  undefined4 local_378 [14];
  StructBuilder local_340;
  ListBuilder local_318;
  StructReader local_2f0;
  Schema local_2c0;
  char *local_2b8;
  size_t local_2b0;
  undefined4 *local_2a8;
  undefined4 *local_2a0;
  NodeTranslator *local_298;
  ulong local_290;
  ulong local_288;
  undefined1 local_280 [16];
  SegmentReader *local_270;
  WirePointer *pWStack_268;
  undefined8 uStack_258;
  undefined8 local_250;
  char local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 *local_210;
  BrandScope *pBStack_208;
  undefined4 local_200 [12];
  StructBuilder local_1d0;
  StructBuilder local_1a8;
  PointerBuilder local_180;
  StructBuilder local_168;
  undefined1 local_140 [48];
  BrandScope *pBStack_110;
  word local_108;
  SegmentBuilder *pSStack_100;
  CapTableBuilder *local_f8;
  word *pwStack_f0;
  StructReader local_e8;
  StructReader local_b8 [2];
  ListBuilder local_58;
  
  local_2b0 = targetsFlagName.content.size_;
  local_2b8 = targetsFlagName.content.ptr;
  if ((annotations.reader.elementCount == 0) || (this->compileAnnotations == false)) {
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  }
  else {
    Orphanage::newOrphan<capnp::List<capnp::schema::Annotation,(capnp::Kind)3>>
              (__return_storage_ptr__,&this->orphanage,annotations.reader.elementCount);
    capnp::_::OrphanBuilder::asStructList
              (&local_58,&__return_storage_ptr__->builder,(StructSize)0x20001);
    if (annotations.reader.elementCount != 0) {
      local_2a8 = local_200;
      local_2a0 = local_378;
      uVar26 = 0;
      local_2c0.raw = (RawBrandedSchema *)(schemas::s_ec1619d4400a0290 + 0x48);
      local_298 = this;
      do {
        capnp::_::ListReader::getStructElement(&local_2f0,&annotations.reader,(ElementCount)uVar26);
        local_288 = uVar26;
        capnp::_::ListBuilder::getStructElement(&local_340,&local_58,(ElementCount)uVar26);
        local_3f8 = local_340.segment;
        aStack_3f0.intValue = (int64_t)local_340.capTable;
        aStack_3f0.textValue.super_StringPtr.content.size_ = (size_t)local_340.pointers;
        capnp::_::PointerBuilder::initStruct
                  ((StructBuilder *)local_280,(PointerBuilder *)&local_3f8,(StructSize)0x10002);
        *(undefined2 *)&((WireValue<uint32_t> *)&local_270->arena)->value = 0;
        local_280._8_8_ = local_2f0.capTable;
        local_270 = (SegmentReader *)local_2f0.pointers;
        local_280._0_8_ = local_2f0.segment;
        LVar20 = local_2f0.nestingLimit;
        if (local_2f0.pointerCount == 0) {
          local_280._8_8_ = (CapTableReader *)0x0;
          local_270 = (SegmentReader *)0x0;
          local_280._0_8_ = (SegmentBuilder *)0x0;
          LVar20 = 0x7fffffff;
        }
        pWStack_268 = (WirePointer *)CONCAT44(pWStack_268._4_4_,LVar20);
        capnp::_::PointerReader::getStruct(&local_428,(PointerReader *)local_280,(word *)0x0);
        pWVar21 = (WirePointer *)0x0;
        FVar29.exception = (Exception *)0x0;
        pSVar23 = (SegmentBuilder *)0x0;
        implicitMethodParams.params.reader._44_4_ = uStack_464;
        implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
        implicitMethodParams.params.reader._39_1_ = uStack_469;
        implicitMethodParams.params.reader.structDataSize = 0;
        implicitMethodParams.params.reader.structPointerCount = 0;
        implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
        source._reader.capTable._0_4_ = (int)local_428.capTable;
        source._reader.segment = local_428.segment;
        source._reader.capTable._4_4_ = (int)((ulong)local_428.capTable >> 0x20);
        source._reader.data._0_4_ = (int)local_428.data;
        source._reader.data._4_4_ = (int)((ulong)local_428.data >> 0x20);
        source._reader.pointers._0_4_ = (int)local_428.pointers;
        source._reader.pointers._4_4_ = (int)((ulong)local_428.pointers >> 0x20);
        source._reader.dataSize = local_428.dataSize;
        source._reader.pointerCount = local_428.pointerCount;
        source._reader._38_2_ = local_428._38_2_;
        source._reader.nestingLimit = local_428.nestingLimit;
        source._reader._44_4_ = local_428._44_4_;
        auVar11 = ZEXT1640(ZEXT816(0));
        implicitMethodParams.scopeId = auVar11._0_8_;
        implicitMethodParams.params.reader.segment = (SegmentReader *)auVar11._8_8_;
        implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar11._16_8_;
        implicitMethodParams.params.reader.ptr = (byte *)auVar11._24_8_;
        implicitMethodParams.params.reader.elementCount = auVar11._32_4_;
        implicitMethodParams.params.reader.step = auVar11._36_4_;
        BrandScope::compileDeclExpression
                  ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&local_3f8,
                   (this->localBrand).ptr,source,this->resolver,implicitMethodParams);
        local_280[0] = local_3f8._0_1_;
        if (local_3f8._0_1_ == VOID) {
          local_280._8_4_ = aStack_3f0.intValue._0_4_;
          if (aStack_3f0.intValue._0_4_ == 2) {
            pWStack_268 = (WirePointer *)CONCAT44(aStack_3f0._20_4_,aStack_3f0._16_4_);
            local_270 = (SegmentReader *)aStack_3f0.textValue.super_StringPtr.content.size_;
          }
          else if (aStack_3f0.intValue._0_4_ == 1) {
            local_250 = aStack_3f0._40_8_;
            pWStack_268 = (WirePointer *)CONCAT44(aStack_3f0._20_4_,aStack_3f0._16_4_);
            uStack_258 = CONCAT44(aStack_3f0._36_4_,aStack_3f0._32_4_);
            local_270 = (SegmentReader *)aStack_3f0.textValue.super_StringPtr.content.size_;
            local_248 = aStack_3f0.field12[0x30];
            if (aStack_3f0.field12[0x30] == '\x01') {
              local_220 = local_398;
              uStack_218 = uStack_390;
              local_230 = local_3a8;
              uStack_228 = uStack_3a0;
              local_240 = aStack_3f0._56_8_;
              uStack_238 = uStack_3b0;
            }
          }
          uVar32 = *local_2a0;
          uVar38 = local_2a0[1];
          uVar39 = local_2a0[2];
          uVar40 = local_2a0[3];
          uVar4 = local_2a0[4];
          uVar5 = local_2a0[5];
          uVar6 = local_2a0[6];
          uVar7 = local_2a0[7];
          uVar8 = local_2a0[9];
          uVar9 = local_2a0[10];
          uVar10 = local_2a0[0xb];
          local_2a8[8] = local_2a0[8];
          local_2a8[9] = uVar8;
          local_2a8[10] = uVar9;
          local_2a8[0xb] = uVar10;
          local_2a8[4] = uVar4;
          local_2a8[5] = uVar5;
          local_2a8[6] = uVar6;
          local_2a8[7] = uVar7;
          *local_2a8 = uVar32;
          local_2a8[1] = uVar38;
          local_2a8[2] = uVar39;
          local_2a8[3] = uVar40;
          pBStack_208 = pBStack_380;
          local_210 = local_388;
          pBStack_380 = (BrandScope *)0x0;
          if (aStack_3f0.intValue._0_4_ == 1) {
            aStack_3f0.uintValue = aStack_3f0.uintValue & 0xffffffff00000000;
          }
          if (aStack_3f0.intValue._0_4_ == 2) {
            aStack_3f0.uintValue = aStack_3f0.uintValue & 0xffffffff00000000;
          }
        }
        pBVar17 = pBStack_208;
        if (local_3f8._0_1_ == VOID) {
          iVar42 = local_428.nestingLimit;
          uVar39 = SUB84(local_428.data,0);
          uVar40 = SUB84(local_428.pointers,0);
          uVar32 = SUB84(local_428.segment,0);
          uVar38 = SUB84(local_428.capTable,0);
          if (local_280._8_4_ == 2) {
            if (local_460 != 0xb) {
              pEVar1 = this->errorReporter;
              name_00._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb58;
              name_00._reader.segment = (SegmentReader *)in_stack_fffffffffffffb50;
              name_00._reader.data._0_6_ = in_stack_fffffffffffffb60;
              name_00._reader.data._6_2_ = in_stack_fffffffffffffb66;
              name_00._reader.pointers = (WirePointer *)FVar29.exception;
              name_00._reader._32_8_ = pSVar23;
              name_00._reader._40_8_ = pWVar21;
              expressionString(name_00);
              kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                        ((String *)&local_3f8,(kj *)0x272fcb,(char (*) [2])&stack0xfffffffffffffb68,
                         (String *)"\' is not an annotation.",(char (*) [24])in_R8);
              in_R8 = (SegmentBuilder *)
                      (aStack_3f0.textValue.super_StringPtr.content.ptr +
                      (aStack_3f0._0_8_ == (SegmentBuilder *)0x0));
              uVar26 = 0;
              uVar27 = 0;
              if (0x3f < local_428.dataSize) {
                uVar27 = (ulong)*(uint *)((long)local_428.data + 4);
              }
              if (0x9f < local_428.dataSize) {
                uVar26 = (ulong)*(uint *)((long)local_428.data + 0x10);
              }
              (**pEVar1->_vptr_ErrorReporter)(pEVar1,uVar27,uVar26);
              uVar22 = aStack_3f0.uintValue;
              pSVar31 = local_3f8;
              if (local_3f8 != (SegmentBuilder *)0x0) {
                local_3f8 = (SegmentBuilder *)0x0;
                aStack_3f0.intValue = 0;
                (*(code *)**(undefined8 **)&(aStack_3f0.structValue.reader.segment)->arena)
                          (aStack_3f0.textValue.super_StringPtr.content.size_,pSVar31,1);
                in_R8 = (SegmentBuilder *)uVar22;
              }
              if (FVar29.exception != (Exception *)0x0) {
                (**(code **)*pWVar21)(pWVar21,FVar29.exception,1);
                in_R8 = pSVar23;
              }
            }
          }
          else {
            in_stack_fffffffffffffb66 = (short)uStack_258;
            if ((short)uStack_258 == 0xb) {
              if (local_280._8_4_ != 1) {
                local_3f8 = (SegmentBuilder *)0x0;
                aStack_3f0.intValue = 0;
                kj::_::Debug::Fault::init
                          ((Fault *)&stack0xfffffffffffffb68,
                           (EVP_PKEY_CTX *)
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                          );
                kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffb68);
              }
              local_448.builder.ptr = (BrandScope **)0x0;
              local_448.builder.pos = (BrandScope **)0x0;
              local_448.builder.endPtr = (BrandScope **)0x0;
              pBVar25 = pBStack_208;
              do {
                if (((pBVar25->params).size_ != 0) ||
                   ((pBVar25->inherited == true && (pBVar25->leafParamCount != 0)))) {
                  if (local_448.builder.pos == local_448.builder.endPtr) {
                    sVar28 = (long)local_448.builder.endPtr - (long)local_448.builder.ptr >> 2;
                    if (local_448.builder.endPtr == local_448.builder.ptr) {
                      sVar28 = 4;
                    }
                    kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::setCapacity
                              (&local_448,sVar28);
                  }
                  *local_448.builder.pos = pBVar25;
                  local_448.builder.pos = local_448.builder.pos + 1;
                }
                pBVar25 = (pBVar25->parent).ptr.ptr;
              } while (pBVar25 != (BrandScope *)0x0);
              if (local_448.builder.pos != local_448.builder.ptr) {
                local_318.ptr = (byte *)((long)local_340.pointers + 8);
                local_318.segment = local_340.segment;
                local_318.capTable = local_340.capTable;
                capnp::_::PointerBuilder::initStruct
                          ((StructBuilder *)&stack0xfffffffffffffb68,(PointerBuilder *)&local_318,
                           (StructSize)0x10000);
                local_318.ptr = (byte *)0x0;
                local_318.segment = (SegmentBuilder *)FVar29.exception;
                local_318.capTable = (CapTableBuilder *)pSVar23;
                capnp::_::PointerBuilder::initStructList
                          ((ListBuilder *)&local_3f8,(PointerBuilder *)&local_318,
                           (ElementCount)
                           ((ulong)((long)local_448.builder.pos - (long)local_448.builder.ptr) >> 3)
                           ,(StructSize)0x10002);
                if ((long)local_448.builder.pos - (long)local_448.builder.ptr != 0) {
                  uVar26 = (long)local_448.builder.pos - (long)local_448.builder.ptr >> 3;
                  uVar27 = 0;
                  local_290 = uVar26;
                  do {
                    capnp::_::ListBuilder::getStructElement
                              ((StructBuilder *)&stack0xfffffffffffffb68,(ListBuilder *)&local_3f8,
                               (ElementCount)uVar27);
                    uVar37 = uVar27 & 0xffffffff;
                    pBVar25 = local_448.builder.ptr[uVar37];
                    uVar32 = *(undefined4 *)((long)&pBVar25->leafId + 4);
                    pWVar21->offsetAndKind = (WireValue<uint32_t>)*(undefined4 *)&pBVar25->leafId;
                    pWVar21->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)uVar32;
                    if (pBVar25->inherited == true) {
                      *(undefined2 *)&pWVar21[1].offsetAndKind.value = 1;
                    }
                    else {
                      sVar28 = (local_448.builder.ptr[uVar37]->params).size_;
                      *(undefined2 *)&pWVar21[1].offsetAndKind.value = 0;
                      local_1d0.data = (undefined2 *)0x0;
                      local_1d0.segment = (SegmentBuilder *)FVar29.exception;
                      local_1d0.capTable = (CapTableBuilder *)pSVar23;
                      capnp::_::PointerBuilder::initStructList
                                (&local_318,(PointerBuilder *)&local_1d0,(ElementCount)sVar28,
                                 (StructSize)0x10001);
                      uVar35 = (ulong)local_318.elementCount;
                      uVar26 = local_290;
                      this = local_298;
                      if (uVar35 != 0) {
                        lVar34 = 0;
                        uVar36 = 0;
                        do {
                          pBVar2 = (local_448.builder.ptr[uVar37]->params).ptr;
                          pEVar1 = pBVar17->errorReporter;
                          capnp::_::ListBuilder::getStructElement
                                    (&local_1d0,&local_318,(ElementCount)uVar36);
                          *(undefined2 *)local_1d0.data = 1;
                          local_180.segment = local_1d0.segment;
                          local_180.capTable = local_1d0.capTable;
                          local_180.pointer = local_1d0.pointers;
                          capnp::_::PointerBuilder::initStruct
                                    (&local_1a8,&local_180,(StructSize)0x10003);
                          target._builder.segment._4_4_ =
                               (int)((uint7)local_1a8.segment._1_7_ >> 0x18);
                          target._builder.segment._0_4_ =
                               (int)CONCAT71(local_1a8.segment._1_7_,(char)local_1a8.segment);
                          target._builder.capTable._0_4_ = (int)local_1a8.capTable;
                          target._builder.capTable._4_4_ = (int)((ulong)local_1a8.capTable >> 0x20);
                          target._builder.data._0_4_ = (int)local_1a8.data;
                          target._builder.data._4_4_ = (int)((ulong)local_1a8.data >> 0x20);
                          target._builder.pointers._0_4_ = (int)local_1a8.pointers;
                          target._builder.pointers._4_4_ = (int)((ulong)local_1a8.pointers >> 0x20);
                          target._builder.dataSize = local_1a8.dataSize;
                          target._builder._36_4_ = local_1a8._36_4_;
                          BrandedDecl::compileAsType
                                    ((BrandedDecl *)((long)&(pBVar2->body).tag + lVar34),pEVar1,
                                     target);
                          uVar36 = uVar36 + 1;
                          lVar34 = lVar34 + 0xa8;
                          uVar26 = local_290;
                          this = local_298;
                        } while (uVar35 != uVar36);
                      }
                    }
                    uVar27 = uVar27 + 1;
                  } while (uVar27 != uVar26);
                }
              }
              ppBVar14 = local_448.builder.endPtr;
              ppBVar13 = local_448.builder.pos;
              ppBVar12 = local_448.builder.ptr;
              if (local_448.builder.ptr != (BrandScope **)0x0) {
                local_448.builder.ptr = (BrandScope **)0x0;
                local_448.builder.pos = (BrandScope **)0x0;
                local_448.builder.endPtr = (BrandScope **)0x0;
                in_R8 = (SegmentBuilder *)((long)ppBVar14 - (long)ppBVar12 >> 3);
                (**(local_448.builder.disposer)->_vptr_ArrayDisposer)
                          (local_448.builder.disposer,ppBVar12,8,
                           (long)ppBVar13 - (long)ppBVar12 >> 3);
              }
              *(SegmentReader **)local_340.data = local_270;
              pRVar3 = this->resolver;
              lVar34 = *local_340.data;
              capnp::_::PointerBuilder::getStruct
                        ((StructBuilder *)&local_3f8,(PointerBuilder *)&stack0xfffffffffffffb68,
                         (StructSize)0x10000,(word *)0x0);
              capnp::_::StructBuilder::asReader((StructBuilder *)&local_3f8);
              (*pRVar3->_vptr_Resolver[6])(&local_1a8,pRVar3,lVar34);
              local_318.segment =
                   (SegmentBuilder *)CONCAT71(local_318.segment._1_7_,(char)local_1a8.segment);
              local_460 = in_stack_fffffffffffffb66;
              if ((char)local_1a8.segment == '\x01') {
                local_318.capTable = local_1a8.capTable;
                Schema::getProto((Reader *)&local_3f8,(Schema *)&local_318.capTable);
                uVar32 = aStack_3f0._32_4_;
                uVar16 = aStack_3f0._28_2_;
                uVar22 = aStack_3f0.intValue;
                pSVar23 = local_3f8;
                lVar34 = CONCAT44(aStack_3f0._20_4_,aStack_3f0._16_4_);
                uStack_469 = (undefined1)((ushort)aStack_3f0._30_2_ >> 8);
                uStack_464 = aStack_3f0._36_4_;
                name_04.content.size_ = local_2b0;
                name_04.content.ptr = local_2b8;
                in_R8 = local_3f8;
                FVar29.exception = (Exception *)local_2c0.raw;
                pSVar31 = local_3f8;
                uVar24 = aStack_3f0.intValue;
                DynamicStruct::Reader::get
                          ((Reader *)&local_3f8,(Reader *)&stack0xfffffffffffffb68,name_04);
                RVar18 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply
                                   ((Reader *)&local_3f8);
                DynamicValue::Reader::~Reader((Reader *)&local_3f8);
                if (!RVar18) {
                  pEVar1 = this->errorReporter;
                  name_01._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb58;
                  name_01._reader.segment = (SegmentReader *)in_stack_fffffffffffffb50;
                  name_01._reader.data._0_6_ = in_stack_fffffffffffffb60;
                  name_01._reader.data._6_2_ = in_stack_fffffffffffffb66;
                  name_01._reader.pointers = (WirePointer *)FVar29.exception;
                  name_01._reader._32_8_ = pSVar31;
                  name_01._reader._40_8_ = uVar24;
                  expressionString(name_01);
                  kj::str<char_const(&)[2],kj::String,char_const(&)[49]>
                            ((String *)&local_3f8,(kj *)0x272fcb,
                             (char (*) [2])&stack0xfffffffffffffb68,
                             (String *)"\' cannot be applied to this kind of declaration.",
                             (char (*) [49])in_R8);
                  in_R8 = (SegmentBuilder *)
                          (aStack_3f0.textValue.super_StringPtr.content.ptr +
                          (aStack_3f0._0_8_ == (SegmentBuilder *)0x0));
                  uVar26 = 0;
                  uVar27 = 0;
                  if (0x3f < local_428.dataSize) {
                    uVar27 = (ulong)*(uint *)((long)local_428.data + 4);
                  }
                  if (0x9f < local_428.dataSize) {
                    uVar26 = (ulong)*(uint *)((long)local_428.data + 0x10);
                  }
                  (**pEVar1->_vptr_ErrorReporter)(pEVar1,uVar27,uVar26);
                  uVar30 = aStack_3f0.textValue.super_StringPtr.content.ptr;
                  pSVar15 = local_3f8;
                  if (local_3f8 != (SegmentBuilder *)0x0) {
                    local_3f8 = (SegmentBuilder *)0x0;
                    aStack_3f0.intValue = 0;
                    (*(code *)**(undefined8 **)&(aStack_3f0.structValue.reader.segment)->arena)
                              (aStack_3f0.textValue.super_StringPtr.content.size_,pSVar15,1);
                    in_R8 = (SegmentBuilder *)uVar30;
                  }
                  if (FVar29.exception != (Exception *)0x0) {
                    (*(code *)((RawSchema *)(((SegmentBuilder *)uVar24)->super_SegmentReader).arena)
                              ->id)(uVar24,FVar29.exception,1);
                    in_R8 = pSVar31;
                  }
                }
                if (local_2f0.dataSize < 0x10) {
                  sVar19 = 0;
                }
                else {
                  sVar19 = *local_2f0.data;
                }
                if (sVar19 == 0) {
                  if ((ushort)uVar16 < 4) {
                    uVar24 = (SegmentBuilder *)0x0;
                    pWVar21 = (WirePointer *)0x0;
                    FVar29.exception = (Exception *)0x0;
                  }
                  else {
                    pWVar21 = (WirePointer *)(lVar34 + 0x18);
                    uVar24 = uVar22;
                    FVar29.exception = (Exception *)pSVar23;
                  }
                  capnp::_::PointerReader::getStruct
                            ((StructReader *)&local_3f8,(PointerReader *)&stack0xfffffffffffffb68,
                             (word *)0x0);
                  if ((aStack_3f0._24_4_ < 0x10) ||
                     ((short)((WireValue<uint32_t> *)&(aStack_3f0.structValue.reader.segment)->arena
                             )->value == 0)) {
                    capnp::_::PointerBuilder::getStruct
                              ((StructBuilder *)&local_3f8,
                               (PointerBuilder *)&stack0xfffffffffffffb68,(StructSize)0x10002,
                               (word *)0x0);
                    *(undefined2 *)
                     &((WireValue<uint32_t> *)&(aStack_3f0.structValue.reader.segment)->arena)->
                      value = 0;
                    local_460 = in_stack_fffffffffffffb66;
                  }
                  else {
                    pEVar1 = this->errorReporter;
                    name_03._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb58;
                    name_03._reader.segment = (SegmentReader *)in_stack_fffffffffffffb50;
                    name_03._reader.data._0_6_ = in_stack_fffffffffffffb60;
                    name_03._reader.data._6_2_ = in_stack_fffffffffffffb66;
                    name_03._reader.pointers = (WirePointer *)FVar29.exception;
                    name_03._reader._32_8_ = uVar24;
                    name_03._reader._40_8_ = pWVar21;
                    expressionString(name_03);
                    kj::str<char_const(&)[2],kj::String,char_const(&)[20]>
                              ((String *)&local_3f8,(kj *)0x272fcb,
                               (char (*) [2])&stack0xfffffffffffffb68,
                               (String *)"\' requires a value.",(char (*) [20])in_R8);
                    in_R8 = (SegmentBuilder *)
                            (aStack_3f0.textValue.super_StringPtr.content.ptr +
                            (aStack_3f0._0_8_ == (SegmentBuilder *)0x0));
                    uVar26 = 0;
                    uVar27 = 0;
                    if (0x3f < local_428.dataSize) {
                      uVar27 = (ulong)*(uint *)((long)local_428.data + 4);
                    }
                    if (0x9f < local_428.dataSize) {
                      uVar26 = (ulong)*(uint *)((long)local_428.data + 0x10);
                    }
                    (**pEVar1->_vptr_ErrorReporter)(pEVar1,uVar27,uVar26);
                    uVar30 = aStack_3f0.textValue.super_StringPtr.content.ptr;
                    pSVar31 = local_3f8;
                    if (local_3f8 != (SegmentBuilder *)0x0) {
                      local_3f8 = (SegmentBuilder *)0x0;
                      aStack_3f0.intValue = 0;
                      (*(code *)**(undefined8 **)&(aStack_3f0.structValue.reader.segment)->arena)
                                (aStack_3f0.textValue.super_StringPtr.content.size_,pSVar31,1);
                      in_R8 = (SegmentBuilder *)uVar30;
                    }
                    if (FVar29.exception != (Exception *)0x0) {
                      (**(code **)*pWVar21)(pWVar21,FVar29.exception,1);
                      in_R8 = (SegmentBuilder *)uVar24;
                    }
                    if ((ushort)uVar16 < 4) {
                      uVar32 = 0x7fffffff;
                      uVar22 = (SegmentBuilder *)0x0;
                      aStack_3f0.textValue.super_StringPtr.content.size_ =
                           (size_t)(SegmentReader *)0x0;
                      pSVar23 = (SegmentBuilder *)0x0;
                    }
                    else {
                      aStack_3f0.structValue.reader.segment = (SegmentReader *)(lVar34 + 0x18);
                    }
                    local_3f8 = pSVar23;
                    aStack_3f0.intValue = uVar22;
                    aStack_3f0._16_4_ = uVar32;
                    capnp::_::PointerReader::getStruct
                              (local_b8,(PointerReader *)&local_3f8,(word *)0x0);
                    local_3f8 = local_340.segment;
                    aStack_3f0.intValue = (int64_t)local_340.capTable;
                    aStack_3f0.textValue.super_StringPtr.content.size_ = (size_t)local_340.pointers;
                    this_00 = (NodeTranslator *)local_140;
                    capnp::_::PointerBuilder::getStruct
                              ((StructBuilder *)this_00,(PointerBuilder *)&local_3f8,
                               (StructSize)0x10002,(word *)0x0);
                    type._reader.capTable._0_4_ = (int)local_b8[0].capTable;
                    type._reader.segment = local_b8[0].segment;
                    type._reader.capTable._4_4_ = (int)((ulong)local_b8[0].capTable >> 0x20);
                    type._reader.data._0_4_ = (int)local_b8[0].data;
                    type._reader.data._4_4_ = (int)((ulong)local_b8[0].data >> 0x20);
                    type._reader.pointers._0_4_ = (int)local_b8[0].pointers;
                    type._reader.pointers._4_4_ = (int)((ulong)local_b8[0].pointers >> 0x20);
                    type._reader.dataSize = (StructDataBitCount)local_b8[0]._32_8_;
                    type._reader._36_4_ = SUB84(local_b8[0]._32_8_,4);
                    type._reader.nestingLimit = (int)local_b8[0]._40_8_;
                    type._reader._44_4_ = SUB84(local_b8[0]._40_8_,4);
                    target_00._builder.capTable = (CapTableBuilder *)local_140._8_8_;
                    target_00._builder.segment = (SegmentBuilder *)local_140._0_8_;
                    target_00._builder.data = (void *)local_140._16_8_;
                    target_00._builder.pointers = (WirePointer *)local_140._24_8_;
                    target_00._builder.dataSize = local_140._32_4_;
                    target_00._builder.pointerCount = local_140._36_2_;
                    target_00._builder._38_2_ = local_140._38_2_;
                    compileDefaultDefaultValue(this_00,type,target_00);
                    local_460 = in_stack_fffffffffffffb66;
                  }
                }
                else {
                  local_460 = in_stack_fffffffffffffb66;
                  if (sVar19 == 1) {
                    if (local_2f0.pointerCount < 2) {
                      aStack_3f0._16_4_ = 0x7fffffff;
                      aStack_3f0.intValue = (int64_t)(CapTableReader *)0x0;
                      aStack_3f0.textValue.super_StringPtr.content.size_ =
                           (size_t)(SegmentReader *)0x0;
                      local_3f8 = (SegmentBuilder *)0x0;
                    }
                    else {
                      aStack_3f0.structValue.reader.segment =
                           (SegmentReader *)((long)local_2f0.pointers + 8);
                      aStack_3f0.intValue = (int64_t)local_2f0.capTable;
                      local_3f8 = (SegmentBuilder *)local_2f0.segment;
                      aStack_3f0._16_4_ = local_2f0.nestingLimit;
                    }
                    capnp::_::PointerReader::getStruct
                              (&local_e8,(PointerReader *)&local_3f8,(word *)0x0);
                    if ((ushort)uVar16 < 4) {
                      uVar32 = 0x7fffffff;
                      uVar22 = (SegmentBuilder *)0x0;
                      aStack_3f0.textValue.super_StringPtr.content.size_ =
                           (size_t)(SegmentReader *)0x0;
                      pSVar23 = (SegmentBuilder *)0x0;
                    }
                    else {
                      aStack_3f0.structValue.reader.segment = (SegmentReader *)(lVar34 + 0x18);
                    }
                    local_3f8 = pSVar23;
                    aStack_3f0.intValue = uVar22;
                    aStack_3f0._16_4_ = uVar32;
                    capnp::_::PointerReader::getStruct
                              ((StructReader *)(local_140 + 0x28),(PointerReader *)&local_3f8,
                               (word *)0x0);
                    local_3f8 = local_340.segment;
                    aStack_3f0.intValue = (int64_t)local_340.capTable;
                    aStack_3f0.textValue.super_StringPtr.content.size_ = (size_t)local_340.pointers;
                    capnp::_::PointerBuilder::getStruct
                              (&local_168,(PointerBuilder *)&local_3f8,(StructSize)0x10002,
                               (word *)0x0);
                    source_00._reader.capTable._0_4_ = (int)local_e8.capTable;
                    source_00._reader.segment = local_e8.segment;
                    source_00._reader.capTable._4_4_ = (int)((ulong)local_e8.capTable >> 0x20);
                    source_00._reader.data._0_4_ = (int)local_e8.data;
                    source_00._reader.data._4_4_ = (int)((ulong)local_e8.data >> 0x20);
                    source_00._reader.pointers._0_4_ = (int)local_e8.pointers;
                    source_00._reader.pointers._4_4_ = (int)((ulong)local_e8.pointers >> 0x20);
                    source_00._reader.dataSize = local_e8.dataSize;
                    source_00._reader._36_4_ = local_e8._36_4_;
                    source_00._reader.nestingLimit = local_e8.nestingLimit;
                    source_00._reader._44_4_ = local_e8._44_4_;
                    type_00._reader.capTable = (CapTableReader *)pBStack_110;
                    type_00._reader.segment = (SegmentReader *)local_140._40_8_;
                    type_00._reader.data = (void *)local_108.content;
                    type_00._reader.pointers = (WirePointer *)pSStack_100;
                    type_00._reader._32_8_ = local_f8;
                    type_00._reader._40_8_ = pwStack_f0;
                    target_01._builder.capTable = local_168.capTable;
                    target_01._builder.segment = local_168.segment;
                    target_01._builder.data = local_168.data;
                    target_01._builder.pointers = local_168.pointers;
                    target_01._builder.dataSize = local_168.dataSize;
                    target_01._builder.pointerCount = local_168.pointerCount;
                    target_01._builder._38_2_ = local_168._38_2_;
                    in_stack_fffffffffffffb50 = local_168.pointers;
                    in_stack_fffffffffffffb58 = local_168._32_8_;
                    compileBootstrapValue
                              (this,source_00,type_00,target_01,(Schema)local_318.capTable);
                    local_460 = in_stack_fffffffffffffb66;
                  }
                }
              }
            }
            else {
              pEVar1 = this->errorReporter;
              name_02._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb58;
              name_02._reader.segment = (SegmentReader *)in_stack_fffffffffffffb50;
              name_02._reader.data._0_6_ = in_stack_fffffffffffffb60;
              name_02._reader.data._6_2_ = (short)uStack_258;
              name_02._reader.pointers = (WirePointer *)FVar29.exception;
              name_02._reader._32_8_ = pSVar23;
              name_02._reader._40_8_ = pWVar21;
              SVar41 = local_428.dataSize;
              expressionString(name_02);
              kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                        ((String *)&local_3f8,(kj *)0x272fcb,(char (*) [2])&stack0xfffffffffffffb68,
                         (String *)"\' is not an annotation.",(char (*) [24])in_R8);
              in_R8 = (SegmentBuilder *)
                      (aStack_3f0.textValue.super_StringPtr.content.ptr +
                      (aStack_3f0._0_8_ == (SegmentBuilder *)0x0));
              uVar26 = 0;
              uVar27 = 0;
              if (0x3f < local_428.dataSize) {
                uVar27 = (ulong)*(uint *)((long)local_428.data + 4);
              }
              if (0x9f < local_428.dataSize) {
                uVar26 = (ulong)*(uint *)((long)local_428.data + 0x10);
              }
              (**pEVar1->_vptr_ErrorReporter)(pEVar1,uVar27,uVar26);
              uVar22 = aStack_3f0.uintValue;
              pSVar31 = local_3f8;
              if (local_3f8 != (SegmentBuilder *)0x0) {
                local_3f8 = (SegmentBuilder *)0x0;
                aStack_3f0.intValue = 0;
                (*(code *)**(undefined8 **)&(aStack_3f0.structValue.reader.segment)->arena)
                          (aStack_3f0.textValue.super_StringPtr.content.size_,pSVar31,1,uVar22,
                           uVar22,0,uVar32,uVar38,uVar39,uVar40,SVar41,iVar42);
                in_R8 = (SegmentBuilder *)uVar22;
              }
              local_460 = in_stack_fffffffffffffb66;
              if (FVar29.exception != (Exception *)0x0) {
                (**(code **)*pWVar21)(pWVar21,FVar29.exception,1);
                in_R8 = pSVar23;
                local_460 = in_stack_fffffffffffffb66;
              }
            }
          }
        }
        pBVar17 = pBStack_208;
        if (local_280[0] == '\x01') {
          if (pBStack_208 != (BrandScope *)0x0) {
            pBStack_208 = (BrandScope *)0x0;
            (**(code **)*local_210)
                      (local_210,
                       (pBVar17->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                       (long)&(pBVar17->super_Refcounted).super_Disposer._vptr_Disposer);
          }
          if (local_280._8_4_ == 1) {
            local_280._8_8_ = local_280._8_8_ & 0xffffffff00000000;
          }
          if (local_280._8_4_ == 2) {
            local_280._8_8_ = local_280._8_8_ & 0xffffffff00000000;
          }
        }
        uVar33 = (int)local_288 + 1;
        uVar26 = (ulong)uVar33;
      } while (uVar33 < annotations.reader.elementCount);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Annotation>> NodeTranslator::compileAnnotationApplications(
    List<Declaration::AnnotationApplication>::Reader annotations,
    kj::StringPtr targetsFlagName) {
  if (annotations.size() == 0 || !compileAnnotations) {
    // Return null.
    return Orphan<List<schema::Annotation>>();
  }

  auto result = orphanage.newOrphan<List<schema::Annotation>>(annotations.size());
  auto builder = result.get();

  for (uint i = 0; i < annotations.size(); i++) {
    Declaration::AnnotationApplication::Reader annotation = annotations[i];
    schema::Annotation::Builder annotationBuilder = builder[i];

    // Set the annotation's value to void in case we fail to produce something better below.
    annotationBuilder.initValue().setVoid();

    auto name = annotation.getName();
    KJ_IF_MAYBE(decl, compileDeclExpression(name, noImplicitParams())) {
      KJ_IF_MAYBE(kind, decl->getKind()) {
        if (*kind != Declaration::ANNOTATION) {
          errorReporter.addErrorOn(name, kj::str(
              "'", expressionString(name), "' is not an annotation."));
        } else {
          annotationBuilder.setId(decl->getIdAndFillBrand(
              [&]() { return annotationBuilder.initBrand(); }));
          KJ_IF_MAYBE(annotationSchema,
                      resolver.resolveBootstrapSchema(annotationBuilder.getId(),
                                                      annotationBuilder.getBrand())) {
            auto node = annotationSchema->getProto().getAnnotation();
            if (!toDynamic(node).get(targetsFlagName).as<bool>()) {
              errorReporter.addErrorOn(name, kj::str(
                  "'", expressionString(name), "' cannot be applied to this kind of declaration."));
            }

            // Interpret the value.
            auto value = annotation.getValue();
            switch (value.which()) {
              case Declaration::AnnotationApplication::Value::NONE:
                // No value, i.e. void.
                if (node.getType().isVoid()) {
                  annotationBuilder.getValue().setVoid();
                } else {
                  errorReporter.addErrorOn(name, kj::str(
                      "'", expressionString(name), "' requires a value."));
                  compileDefaultDefaultValue(node.getType(), annotationBuilder.getValue());
                }
                break;

              case Declaration::AnnotationApplication::Value::EXPRESSION:
                compileBootstrapValue(value.getExpression(), node.getType(),
                                      annotationBuilder.getValue(),
                                      *annotationSchema);
                break;
            }
          }
        }
      } else if (*kind != Declaration::ANNOTATION) {
        errorReporter.addErrorOn(name, kj::str(
            "'", expressionString(name), "' is not an annotation."));
      }
    }
  }

  return result;
}